

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O3

void __thiscall
icu_63::RangeDescriptor::RangeDescriptor
          (RangeDescriptor *this,RangeDescriptor *other,UErrorCode *status)

{
  UVector *this_00;
  UChar32 UVar1;
  UVector *pUVar2;
  void *obj;
  UErrorCode UVar3;
  int index;
  
  UVar1 = other->fEndChar;
  this->fStartChar = other->fStartChar;
  this->fEndChar = UVar1;
  this->fNum = other->fNum;
  this->fNext = (RangeDescriptor *)0x0;
  UVar3 = *status;
  pUVar2 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)other);
  if (pUVar2 != (UVector *)0x0) {
    UVector::UVector(pUVar2,status);
  }
  this->fIncludesSets = pUVar2;
  if (UVar3 < U_ILLEGAL_ARGUMENT_ERROR) {
    if (U_ZERO_ERROR < *status) {
      return;
    }
    if (pUVar2 != (UVector *)0x0) {
      pUVar2 = other->fIncludesSets;
      if (pUVar2->count < 1) {
        return;
      }
      index = 0;
      do {
        this_00 = this->fIncludesSets;
        obj = UVector::elementAt(pUVar2,index);
        UVector::addElement(this_00,obj,status);
        index = index + 1;
        pUVar2 = other->fIncludesSets;
      } while (index < pUVar2->count);
      return;
    }
    UVar3 = U_MEMORY_ALLOCATION_ERROR;
  }
  *status = UVar3;
  return;
}

Assistant:

RangeDescriptor::RangeDescriptor(const RangeDescriptor &other, UErrorCode &status) {
    int  i;

    this->fStartChar    = other.fStartChar;
    this->fEndChar      = other.fEndChar;
    this->fNum          = other.fNum;
    this->fNext         = NULL;
    UErrorCode oldstatus = status;
    this->fIncludesSets = new UVector(status);
    if (U_FAILURE(oldstatus)) {
        status = oldstatus;
    }
    if (U_FAILURE(status)) {
        return;
    }
    /* test for NULL */
    if (this->fIncludesSets == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    for (i=0; i<other.fIncludesSets->size(); i++) {
        this->fIncludesSets->addElement(other.fIncludesSets->elementAt(i), status);
    }
}